

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20250127::debugging_internal::ParseSubstitution(State *state,bool accept_std)

{
  ParseState *pPVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *str;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined8 *puVar9;
  ParseState copy;
  
  iVar3 = state->recursion_depth;
  iVar4 = state->steps;
  state->recursion_depth = iVar3 + 1;
  state->steps = iVar4 + 1;
  if (iVar4 < 0x20000 && iVar3 < 0x100) {
    bVar8 = ParseTwoCharToken(state,"S_");
    if (bVar8) {
LAB_003ef6d6:
      MaybeAppend(state,"?");
LAB_003ef6e5:
      bVar8 = true;
      goto LAB_003ef776;
    }
    uVar5 = (state->parse_state).mangled_idx;
    uVar6 = (state->parse_state).out_cur_idx;
    uVar7 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar8 = ParseOneCharToken(state,'S');
    if (bVar8) {
      bVar8 = ParseSeqId(state);
      if (bVar8) {
        bVar8 = ParseOneCharToken(state,'_');
        if (bVar8) goto LAB_003ef6d6;
      }
    }
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
    bVar8 = ParseOneCharToken(state,'S');
    if (bVar8) {
      for (puVar9 = (undefined8 *)&DAT_007a01a8; puVar9[-1] != 0; puVar9 = puVar9 + 3) {
        cVar2 = *(char *)(puVar9[-1] + 1);
        if ((state->mangled_begin[(state->parse_state).mangled_idx] == cVar2) &&
           (cVar2 != 't' || accept_std)) {
          MaybeAppend(state,"std");
          str = (char *)*puVar9;
          if (*str != '\0') {
            MaybeAppend(state,"::");
            MaybeAppend(state,str);
          }
          pPVar1->mangled_idx = pPVar1->mangled_idx + 1;
          goto LAB_003ef6e5;
        }
      }
    }
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
  }
  bVar8 = false;
LAB_003ef776:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar8;
}

Assistant:

static bool ParseSubstitution(State *state, bool accept_std) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  state->parse_state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != nullptr; ++p) {
      if (RemainingInput(state)[0] == p->abbrev[1] &&
          (accept_std || p->abbrev[1] != 't')) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->parse_state.mangled_idx;
        UpdateHighWaterMark(state);
        return true;
      }
    }
  }
  state->parse_state = copy;
  return false;
}